

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_compile_op(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp env)

{
  sexp psVar1;
  sexp ast_00;
  sexp_sint_t extraout_RDX;
  sexp_sint_t n_00;
  sexp_sint_t extraout_RDX_00;
  sexp tmp;
  sexp ast;
  sexp_conflict local_68;
  sexp local_60;
  sexp_conflict local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_40.var = &local_68;
  local_58 = (sexp_conflict)0x43e;
  local_60 = (sexp)0x43e;
  local_68 = (sexp_conflict)0x43e;
  if (env == (sexp)0x0) {
    env = (ctx->value).type.cpl;
  }
  if ((((ulong)env & 3) == 0) && (env->tag == 0x17)) {
    local_50.var = &local_58;
    local_30.next = &local_50;
    local_50.next = (ctx->value).context.saves;
    local_30.var = &local_60;
    local_40.next = &local_30;
    (ctx->value).context.saves = &local_40;
    psVar1 = sexp_make_eval_context(ctx,(sexp)0x0,env,0,0);
    if ((((ulong)psVar1 & 3) != 0) || (ast_00 = psVar1, psVar1->tag != 0x13)) {
      local_60 = (ctx->value).type.getters;
      (ctx->value).type.getters = psVar1;
      ast_00 = analyze(psVar1,obj,0,1);
      if ((((ulong)ast_00 & 3) != 0) || (ast_00->tag != 0x13)) {
        local_68 = (((psVar1->value).type.setters)->value).opcode.dl;
        n_00 = extraout_RDX;
        while (((local_58 = ast_00, ((ulong)local_68 & 3) == 0 && (local_68->tag == 6)) &&
               ((((ulong)ast_00 & 3) != 0 || (ast_00->tag != 0x13))))) {
          ast_00 = sexp_apply1(psVar1,(((local_68->value).type.name)->value).type.cpl,ast_00);
          local_68 = (local_68->value).type.cpl;
          n_00 = extraout_RDX_00;
        }
        if ((((ulong)ast_00 & 3) != 0) || (ast_00->tag != 0x13)) {
          ast_00 = sexp_generate_op(psVar1,self,n_00,ast_00,psVar1);
        }
      }
      (ctx->value).type.getters = local_60;
      (ctx->value).context.last_fp = (psVar1->value).context.last_fp;
    }
    (ctx->value).context.saves = local_50.next;
    return ast_00;
  }
  psVar1 = sexp_type_exception(ctx,self,0x17,env);
  return psVar1;
}

Assistant:

sexp sexp_compile_op (sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp env) {
  sexp_gc_var3(ast, tmp, res);
  sexp ctx2;
  if (! env) env = sexp_context_env(ctx);
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
  sexp_gc_preserve3(ctx, ast, tmp, res);
  ctx2 = sexp_make_eval_context(ctx, NULL, env, 0, 0);
  if (sexp_exceptionp(ctx2)) {
    res = ctx2;
  } else {
    tmp = sexp_context_child(ctx);
    sexp_context_child(ctx) = ctx2;
    ast = sexp_analyze(ctx2, obj);
    if (sexp_exceptionp(ast)) {
      res = ast;
    } else {
      res = sexp_global(ctx2, SEXP_G_OPTIMIZATIONS);
      for ( ; sexp_pairp(res) && !sexp_exceptionp(ast); res=sexp_cdr(res))
        ast = sexp_apply1(ctx2, sexp_cdar(res), ast);
      if (sexp_exceptionp(ast)) {
        res = ast;
      } else {
        res = sexp_generate_op(ctx2, self, n, ast, ctx2);
      }
    }
    sexp_context_child(ctx) = tmp;
    sexp_context_last_fp(ctx) = sexp_context_last_fp(ctx2);
  }
  sexp_gc_release3(ctx);
  return res;
}